

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O2

xmlSchematronPtr xmlSchematronParse(xmlSchematronParserCtxtPtr ctxt)

{
  long lVar1;
  xmlDictPtr dict;
  xmlSchematronPtr pxVar2;
  xmlSchematronRulePtr_conflict pxVar3;
  xmlSchematronTestType type;
  bool bVar4;
  xmlSchematronPatternPtr_conflict pxVar5;
  int iVar6;
  int iVar7;
  xmlDocPtr doc;
  xmlNodePtr node;
  xmlSchematronPtr schema;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlChar **ppxVar10;
  xmlChar *pxVar11;
  xmlSchematronPatternPtr pxVar12;
  xmlPatternPtr pxVar13;
  xmlSchematronRulePtr_conflict rule;
  xmlSchematronRulePtr_conflict *ppxVar14;
  xmlSchematronTestPtr_conflict pxVar15;
  char *pcVar16;
  xmlSchematronPatternPtr_conflict pxVar17;
  xmlSchematronRulePtr_conflict pxVar18;
  xmlChar *in_R9;
  _xmlNode **pp_Var19;
  _xmlNode *cur;
  _xmlNode *node_00;
  _xmlNode *node_01;
  int local_54;
  
  if (ctxt == (xmlSchematronParserCtxtPtr)0x0) {
    return (xmlSchematronPtr)0x0;
  }
  ctxt->nberrors = 0;
  if (ctxt->URL == (xmlChar *)0x0) {
    if (ctxt->buffer != (char *)0x0) {
      doc = xmlReadMemory(ctxt->buffer,ctxt->size,(char *)0x0,(char *)0x0,2);
      if (doc == (xmlDocPtr)0x0) {
        iVar6 = 0x6e6;
        goto LAB_0017f6a4;
      }
      pxVar8 = xmlStrdup((xmlChar *)"in_memory_buffer");
      doc->URL = pxVar8;
      pxVar8 = xmlDictLookup(ctxt->dict,(xmlChar *)"in_memory_buffer",-1);
      ctxt->URL = pxVar8;
      goto LAB_0017f491;
    }
    doc = ctxt->doc;
    if (doc == (xmlDocPtr)0x0) {
      iVar6 = 0x6de;
LAB_0017f6a4:
      pcVar16 = "xmlSchematronParse: could not parse.\n";
      pxVar8 = (xmlChar *)0x0;
LAB_0017f6a7:
      xmlSchematronPErr(ctxt,(xmlNodePtr)0x0,iVar6,pcVar16,pxVar8,in_R9);
      return (xmlSchematronPtr)0x0;
    }
    iVar6 = 1;
    bVar4 = false;
  }
  else {
    doc = xmlReadFile((char *)ctxt->URL,(char *)0x0,2);
    if (doc == (xmlDocPtr)0x0) {
      pxVar8 = ctxt->URL;
      pcVar16 = "xmlSchematronParse: could not load \'%s\'.\n";
      iVar6 = 0x6dd;
      goto LAB_0017f6a7;
    }
LAB_0017f491:
    iVar6 = 0;
    bVar4 = true;
  }
  ctxt->preserve = iVar6;
  node = xmlDocGetRootElement(doc);
  if (node == (xmlNodePtr)0x0) {
    xmlSchematronPErr(ctxt,(xmlNodePtr)doc,0x6df,"The schema has no document element.\n",
                      (xmlChar *)0x0,in_R9);
    if (bVar4) {
      xmlFreeDoc(doc);
      return (xmlSchematronPtr)0x0;
    }
    return (xmlSchematronPtr)0x0;
  }
  if ((((node->type == XML_ELEMENT_NODE) && (node->ns != (xmlNs *)0x0)) &&
      (iVar6 = xmlStrEqual(node->name,"schema"), iVar6 != 0)) &&
     ((iVar6 = xmlStrEqual(node->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
      iVar6 != 0 ||
      (iVar6 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
      iVar6 != 0)))) {
    schema = (xmlSchematronPtr)(*xmlMalloc)(0x60);
    if (schema != (xmlSchematronPtr)0x0) {
      schema->nbNamespaces = 0;
      schema->maxNamespaces = 0;
      schema->namespaces = (xmlChar **)0x0;
      schema->patterns = (xmlSchematronPatternPtr_conflict)0x0;
      schema->rules = (xmlSchematronRulePtr_conflict)0x0;
      schema->title = (xmlChar *)0x0;
      schema->nbNs = 0;
      schema->nbPattern = 0;
      schema->_private = (void *)0x0;
      schema->dict = (xmlDictPtr)0x0;
      schema->doc = (xmlDocPtr)0x0;
      *(undefined8 *)&schema->flags = 0;
      schema->name = (xmlChar *)0x0;
      *(undefined8 *)&schema->preserve = 0;
      dict = ctxt->dict;
      schema->dict = dict;
      xmlDictReference(dict);
      ctxt->schema = schema;
      pp_Var19 = &node->children;
      while (cur = *pp_Var19, cur != (xmlNode *)0x0) {
        if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
           ((iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
            iVar6 != 0 ||
            (iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
            iVar6 != 0)))) {
          if ((((cur->type != XML_ELEMENT_NODE) || (cur->ns == (xmlNs *)0x0)) ||
              (iVar6 = xmlStrEqual(cur->name,(xmlChar *)"title"), iVar6 == 0)) ||
             ((iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
              iVar6 == 0 &&
              (iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
              iVar6 == 0)))) goto LAB_0017f7dd;
          pxVar8 = xmlNodeGetContent(cur);
          if (pxVar8 != (xmlChar *)0x0) {
            pxVar9 = xmlDictLookup(schema->dict,pxVar8,-1);
            schema->title = pxVar9;
            (*xmlFree)(pxVar8);
          }
          goto LAB_0017f781;
        }
        pp_Var19 = &cur->next;
      }
LAB_0017f7c0:
      cur = (xmlNode *)0x0;
LAB_0017f7dd:
      do {
        if ((((cur == (xmlNode *)0x0) || (cur->type != XML_ELEMENT_NODE)) ||
            (cur->ns == (xmlNs *)0x0)) ||
           ((iVar6 = xmlStrEqual(cur->name,"ns"), iVar6 == 0 ||
            ((iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
             iVar6 == 0 &&
             (iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
             iVar6 == 0)))))) goto LAB_0017fa76;
        pxVar8 = xmlGetNoNsProp(cur,"prefix");
        pxVar9 = xmlGetNoNsProp(cur,"uri");
        if ((pxVar9 == (xmlChar *)0x0) || (*pxVar9 == '\0')) {
          xmlSchematronPErr(ctxt,cur,0x6df,"ns element has no uri",(xmlChar *)0x0,in_R9);
        }
        if ((pxVar8 == (xmlChar *)0x0) || (*pxVar8 == '\0')) {
          xmlSchematronPErr(ctxt,cur,0x6df,"ns element has no prefix",(xmlChar *)0x0,in_R9);
        }
        if (pxVar9 == (xmlChar *)0x0 || pxVar8 == (xmlChar *)0x0) {
          if (pxVar9 != (xmlChar *)0x0) goto LAB_0017f9c6;
        }
        else {
          xmlXPathRegisterNs(ctxt->xctxt,pxVar8,pxVar9);
          if (ctxt->namespaces == (xmlChar **)0x0) {
            ctxt->maxNamespaces = 10;
            ppxVar10 = (xmlChar **)(*xmlMalloc)(0xa0);
            ctxt->namespaces = ppxVar10;
            if (ppxVar10 != (xmlChar **)0x0) {
              ctxt->nbNamespaces = 0;
              goto LAB_0017f941;
            }
            xmlSchematronPErrMemory
                      ((xmlSchematronParserCtxtPtr)0x0,"allocating parser namespaces",
                       (xmlNodePtr)0x0);
          }
          else {
            if (ctxt->maxNamespaces <= ctxt->nbNamespaces + 2) {
              ppxVar10 = (xmlChar **)(*xmlRealloc)(ctxt->namespaces,(long)ctxt->maxNamespaces << 5);
              if (ppxVar10 == (xmlChar **)0x0) {
                xmlSchematronPErrMemory
                          ((xmlSchematronParserCtxtPtr)0x0,"allocating parser namespaces",
                           (xmlNodePtr)0x0);
                goto LAB_0017f9b7;
              }
              ctxt->namespaces = ppxVar10;
              ctxt->maxNamespaces = ctxt->maxNamespaces << 1;
            }
LAB_0017f941:
            pxVar11 = xmlDictLookup(ctxt->dict,pxVar9,-1);
            ctxt->namespaces[(long)ctxt->nbNamespaces * 2] = pxVar11;
            pxVar11 = xmlDictLookup(ctxt->dict,pxVar8,-1);
            iVar6 = ctxt->nbNamespaces;
            lVar1 = (long)iVar6 + 1;
            ctxt->namespaces[(long)iVar6 * 2 + 1] = pxVar11;
            ctxt->nbNamespaces = (int)lVar1;
            ctxt->namespaces[lVar1 * 2] = (xmlChar *)0x0;
            ctxt->namespaces[iVar6 * 2 + 3] = (xmlChar *)0x0;
          }
LAB_0017f9b7:
          schema->nbNs = schema->nbNs + 1;
LAB_0017f9c6:
          (*xmlFree)(pxVar9);
        }
        if (pxVar8 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar8);
        }
        while (cur = cur->next, cur != (_xmlNode *)0x0) {
          if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
             ((iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
              iVar6 != 0 ||
              (iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
              iVar6 != 0)))) break;
        }
      } while( true );
    }
    schema = (xmlSchematronPtr)0x0;
    xmlSchematronPErrMemory(ctxt,"allocating schema",(xmlNodePtr)0x0);
  }
  else {
    xmlSchematronPErr(ctxt,node,0x6df,"The XML document \'%s\' is not a XML schematron document",
                      ctxt->URL,in_R9);
    schema = (xmlSchematronPtr)0x0;
  }
  goto LAB_0017f5e2;
  while (((cur->type != XML_ELEMENT_NODE || (cur->ns == (xmlNs *)0x0)) ||
         ((iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
          iVar6 == 0 &&
          (iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
          iVar6 == 0))))) {
LAB_0017f781:
    cur = cur->next;
    if (cur == (_xmlNode *)0x0) goto LAB_0017f7c0;
  }
  goto LAB_0017f7dd;
LAB_0017fa76:
  if (cur != (xmlNode *)0x0) {
    if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
       ((iVar6 = xmlStrEqual(cur->name,"pattern"), iVar6 != 0 &&
        ((iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
         iVar6 != 0 ||
         (iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
         iVar6 != 0)))))) {
      pxVar8 = xmlGetNoNsProp(cur,"id");
      if (pxVar8 == (xmlChar *)0x0) {
        pxVar8 = xmlGetNoNsProp(cur,"name");
      }
      pxVar2 = ctxt->schema;
      if (pxVar8 == (xmlChar *)0x0 || pxVar2 == (xmlSchematronPtr)0x0) {
        if (pxVar8 != (xmlChar *)0x0) {
LAB_0017fbca:
          (*xmlFree)(pxVar8);
        }
      }
      else {
        pxVar12 = (xmlSchematronPatternPtr)(*xmlMalloc)(0x18);
        if (pxVar12 == (xmlSchematronPatternPtr)0x0) {
          xmlSchematronPErrMemory(ctxt,"allocating schema pattern",cur);
          goto LAB_0017fbca;
        }
        pxVar12->name = pxVar8;
        pxVar12->next = (xmlSchematronPatternPtr)0x0;
        pxVar12->rules = (xmlSchematronRulePtr_conflict)0x0;
        pxVar5 = pxVar2->patterns;
        if (pxVar2->patterns == (xmlSchematronPatternPtr_conflict)0x0) {
          pxVar17 = (xmlSchematronPatternPtr_conflict)&pxVar2->patterns;
        }
        else {
          do {
            pxVar17 = pxVar5;
            pxVar5 = pxVar17->next;
          } while (pxVar17->next != (xmlSchematronPatternPtr)0x0);
        }
        pxVar17->next = pxVar12;
        pp_Var19 = &cur->children;
        while ((node_00 = *pp_Var19, node_00 != (_xmlNode *)0x0 &&
               (((node_00->type != XML_ELEMENT_NODE || (node_00->ns == (xmlNs *)0x0)) ||
                ((iVar6 = xmlStrEqual(node_00->ns->href,
                                      (xmlChar *)"http://purl.oclc.org/dsdl/schematron"), iVar6 == 0
                 && (iVar6 = xmlStrEqual(node_00->ns->href,
                                         (xmlChar *)"http://www.ascc.net/xml/schematron"),
                    iVar6 == 0))))))) {
          pp_Var19 = &node_00->next;
        }
        local_54 = 0;
LAB_0017fc41:
        if (node_00 != (xmlNode *)0x0) {
          if ((((node_00->type == XML_ELEMENT_NODE) && (node_00->ns != (xmlNs *)0x0)) &&
              (iVar6 = xmlStrEqual(node_00->name,"rule"), iVar6 != 0)) &&
             ((iVar6 = xmlStrEqual(node_00->ns->href,
                                   (xmlChar *)"http://purl.oclc.org/dsdl/schematron"), iVar6 != 0 ||
              (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"
                                  ), iVar6 != 0)))) {
            pxVar8 = xmlGetNoNsProp(node_00,"context");
            if (pxVar8 == (xmlChar *)0x0) {
              pcVar16 = "rule has no context attribute";
LAB_0017fde4:
              xmlSchematronPErr(ctxt,node_00,0x6df,pcVar16,(xmlChar *)0x0,in_R9);
            }
            else if (*pxVar8 == '\0') {
              xmlSchematronPErr(ctxt,node_00,0x6df,"rule has an empty context attribute",
                                (xmlChar *)0x0,in_R9);
              (*xmlFree)(pxVar8);
            }
            else {
              pxVar2 = ctxt->schema;
              if (pxVar2 != (xmlSchematronPtr)0x0) {
                pxVar13 = xmlPatterncompile(pxVar8,ctxt->dict,1,ctxt->namespaces);
                if (pxVar13 == (xmlPatternPtr)0x0) {
                  xmlSchematronPErr(ctxt,node_00,0x6df,"Failed to compile context expression %s",
                                    pxVar8,in_R9);
                }
                rule = (xmlSchematronRulePtr_conflict)(*xmlMalloc)(0x38);
                if (rule != (xmlSchematronRulePtr_conflict)0x0) {
                  rule->patnext = (xmlSchematronRulePtr)0x0;
                  rule->node = (xmlNodePtr)0x0;
                  rule->context = (xmlChar *)0x0;
                  rule->tests = (xmlSchematronTestPtr_conflict)0x0;
                  rule->node = node_00;
                  rule->context = pxVar8;
                  rule->pattern = pxVar13;
                  rule->report = (xmlChar *)0x0;
                  rule->next = (xmlSchematronRulePtr)0x0;
                  pxVar3 = pxVar2->rules;
                  if (pxVar2->rules == (xmlSchematronRulePtr_conflict)0x0) {
                    pxVar18 = (xmlSchematronRulePtr_conflict)&pxVar2->rules;
                  }
                  else {
                    do {
                      pxVar18 = pxVar3;
                      pxVar3 = pxVar18->next;
                    } while (pxVar18->next != (xmlSchematronRulePtr)0x0);
                  }
                  pxVar18->next = rule;
                  rule->patnext = (xmlSchematronRulePtr)0x0;
                  pxVar3 = pxVar12->rules;
                  ppxVar14 = &pxVar12->rules;
                  if (pxVar3 != (xmlSchematronRulePtr_conflict)0x0) {
                    do {
                      pxVar18 = pxVar3;
                      pxVar3 = pxVar18->patnext;
                    } while (pxVar3 != (xmlSchematronRulePtr)0x0);
                    ppxVar14 = &pxVar18->patnext;
                  }
                  *ppxVar14 = rule;
                  pp_Var19 = &node_00->children;
                  while ((node_01 = *pp_Var19, node_01 != (_xmlNode *)0x0 &&
                         (((node_01->type != XML_ELEMENT_NODE || (node_01->ns == (xmlNs *)0x0)) ||
                          ((iVar6 = xmlStrEqual(node_01->ns->href,
                                                (xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
                           iVar6 == 0 &&
                           (iVar6 = xmlStrEqual(node_01->ns->href,
                                                (xmlChar *)"http://www.ascc.net/xml/schematron"),
                           iVar6 == 0))))))) {
                    pp_Var19 = &node_01->next;
                  }
                  iVar6 = 0;
LAB_0017fedc:
                  if (node_01 != (xmlNode *)0x0) {
                    if (node_01->type == XML_ELEMENT_NODE) {
                      if (((node_01->ns == (xmlNs *)0x0) ||
                          (iVar7 = xmlStrEqual(node_01->name,"assert"), iVar7 == 0)) ||
                         ((iVar7 = xmlStrEqual(node_01->ns->href,
                                               (xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
                          iVar7 == 0 &&
                          (iVar7 = xmlStrEqual(node_01->ns->href,
                                               (xmlChar *)"http://www.ascc.net/xml/schematron"),
                          iVar7 == 0)))) {
                        if ((((node_01->type != XML_ELEMENT_NODE) || (node_01->ns == (xmlNs *)0x0))
                            || (iVar7 = xmlStrEqual(node_01->name,"report"), iVar7 == 0)) ||
                           ((iVar7 = xmlStrEqual(node_01->ns->href,
                                                 (xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
                            iVar7 == 0 &&
                            (iVar7 = xmlStrEqual(node_01->ns->href,
                                                 (xmlChar *)"http://www.ascc.net/xml/schematron"),
                            iVar7 == 0)))) goto LAB_00180028;
                        pxVar8 = xmlGetNoNsProp(node_01,"test");
                        if (pxVar8 != (xmlChar *)0x0) {
                          if (*pxVar8 == '\0') goto LAB_001800a9;
                          in_R9 = xmlNodeGetContent(node_01);
                          type = XML_SCHEMATRON_REPORT;
                          goto LAB_0017fffc;
                        }
LAB_0018008d:
                        iVar6 = iVar6 + 1;
                        pcVar16 = "assert has no test attribute";
                        pxVar8 = (xmlChar *)0x0;
                        goto LAB_0018003e;
                      }
                      pxVar8 = xmlGetNoNsProp(node_01,"test");
                      if (pxVar8 == (xmlChar *)0x0) goto LAB_0018008d;
                      if (*pxVar8 == '\0') {
LAB_001800a9:
                        iVar6 = iVar6 + 1;
                        xmlSchematronPErr(ctxt,node_01,0x6df,"assert has an empty test attribute",
                                          (xmlChar *)0x0,in_R9);
                        (*xmlFree)(pxVar8);
                      }
                      else {
                        in_R9 = xmlNodeGetContent(node_01);
                        type = XML_SCHEMATRON_ASSERT;
LAB_0017fffc:
                        iVar6 = iVar6 + 1;
                        pxVar15 = xmlSchematronAddTest(ctxt,type,rule,node_01,pxVar8,in_R9);
                        if (pxVar15 == (xmlSchematronTestPtr_conflict)0x0) {
                          (*xmlFree)(pxVar8);
                        }
                      }
                    }
                    else {
LAB_00180028:
                      pxVar8 = node_01->name;
                      pcVar16 = "Expecting an assert or a report element instead of %s";
LAB_0018003e:
                      xmlSchematronPErr(ctxt,node_01,0x6df,pcVar16,pxVar8,in_R9);
                    }
                    while (node_01 = node_01->next, node_01 != (_xmlNode *)0x0) {
                      if (((node_01->type == XML_ELEMENT_NODE) && (node_01->ns != (xmlNs *)0x0)) &&
                         ((iVar7 = xmlStrEqual(node_01->ns->href,
                                               (xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
                          iVar7 != 0 ||
                          (iVar7 = xmlStrEqual(node_01->ns->href,
                                               (xmlChar *)"http://www.ascc.net/xml/schematron"),
                          iVar7 != 0)))) break;
                    }
                    goto LAB_0017fedc;
                  }
                  if (iVar6 == 0) {
                    pcVar16 = "rule has no assert nor report element";
                    goto LAB_0017fde4;
                  }
                  goto LAB_001800e7;
                }
                xmlSchematronPErrMemory(ctxt,"allocating schema rule",node_00);
              }
              (*xmlFree)(pxVar8);
            }
LAB_001800e7:
            local_54 = local_54 + 1;
          }
          else {
            xmlSchematronPErr(ctxt,node_00,0x6df,"Expecting a rule element instead of %s",
                              node_00->name,in_R9);
          }
          while (node_00 = node_00->next, node_00 != (_xmlNode *)0x0) {
            if (((node_00->type == XML_ELEMENT_NODE) && (node_00->ns != (xmlNs *)0x0)) &&
               ((iVar6 = xmlStrEqual(node_00->ns->href,
                                     (xmlChar *)"http://purl.oclc.org/dsdl/schematron"), iVar6 != 0
                || (iVar6 = xmlStrEqual(node_00->ns->href,
                                        (xmlChar *)"http://www.ascc.net/xml/schematron"), iVar6 != 0
                   )))) break;
          }
          goto LAB_0017fc41;
        }
        if (local_54 == 0) {
          xmlSchematronPErr(ctxt,cur,0x6df,"Pattern has no rule element",(xmlChar *)0x0,in_R9);
        }
      }
      schema->nbPattern = schema->nbPattern + 1;
    }
    else {
      xmlSchematronPErr(ctxt,cur,0x6df,"Expecting a pattern element instead of %s",cur->name,in_R9);
    }
    while (cur = cur->next, cur != (_xmlNode *)0x0) {
      if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
         ((iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
          iVar6 != 0 ||
          (iVar6 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
          iVar6 != 0)))) break;
    }
    goto LAB_0017fa76;
  }
  if (schema->nbPattern != 0) {
    schema->doc = doc;
    if (!bVar4) {
      schema->preserve = 1;
    }
    goto LAB_0017f5f4;
  }
  xmlSchematronPErr(ctxt,node,0x6df,"The schematron document \'%s\' has no pattern",ctxt->URL,in_R9)
  ;
LAB_0017f5e2:
  if (bVar4) {
    xmlFreeDoc(doc);
  }
  if (schema == (xmlSchematronPtr)0x0) {
    return (xmlSchematronPtr)0x0;
  }
LAB_0017f5f4:
  if (ctxt->nberrors != 0) {
    xmlSchematronFree(schema);
    return (xmlSchematronPtr)0x0;
  }
  schema->namespaces = ctxt->namespaces;
  schema->nbNamespaces = ctxt->nbNamespaces;
  ctxt->namespaces = (xmlChar **)0x0;
  return schema;
}

Assistant:

xmlSchematronPtr
xmlSchematronParse(xmlSchematronParserCtxtPtr ctxt)
{
    xmlSchematronPtr ret = NULL;
    xmlDocPtr doc;
    xmlNodePtr root, cur;
    int preserve = 0;

    if (ctxt == NULL)
        return (NULL);

    ctxt->nberrors = 0;

    /*
     * First step is to parse the input document into an DOM/Infoset
     */
    if (ctxt->URL != NULL) {
        doc = xmlReadFile((const char *) ctxt->URL, NULL,
	                  SCHEMATRON_PARSE_OPTIONS);
        if (doc == NULL) {
	    xmlSchematronPErr(ctxt, NULL,
			  XML_SCHEMAP_FAILED_LOAD,
                          "xmlSchematronParse: could not load '%s'.\n",
                          ctxt->URL, NULL);
            return (NULL);
        }
	ctxt->preserve = 0;
    } else if (ctxt->buffer != NULL) {
        doc = xmlReadMemory(ctxt->buffer, ctxt->size, NULL, NULL,
	                    SCHEMATRON_PARSE_OPTIONS);
        if (doc == NULL) {
	    xmlSchematronPErr(ctxt, NULL,
			  XML_SCHEMAP_FAILED_PARSE,
                          "xmlSchematronParse: could not parse.\n",
                          NULL, NULL);
            return (NULL);
        }
        doc->URL = xmlStrdup(BAD_CAST "in_memory_buffer");
        ctxt->URL = xmlDictLookup(ctxt->dict, BAD_CAST "in_memory_buffer", -1);
	ctxt->preserve = 0;
    } else if (ctxt->doc != NULL) {
        doc = ctxt->doc;
	preserve = 1;
	ctxt->preserve = 1;
    } else {
	xmlSchematronPErr(ctxt, NULL,
		      XML_SCHEMAP_NOTHING_TO_PARSE,
		      "xmlSchematronParse: could not parse.\n",
		      NULL, NULL);
        return (NULL);
    }

    /*
     * Then extract the root and Schematron parse it
     */
    root = xmlDocGetRootElement(doc);
    if (root == NULL) {
	xmlSchematronPErr(ctxt, (xmlNodePtr) doc,
		      XML_SCHEMAP_NOROOT,
		      "The schema has no document element.\n", NULL, NULL);
	if (!preserve) {
	    xmlFreeDoc(doc);
	}
        return (NULL);
    }

    if (!IS_SCHEMATRON(root, "schema")) {
	xmlSchematronPErr(ctxt, root,
	    XML_SCHEMAP_NOROOT,
	    "The XML document '%s' is not a XML schematron document",
	    ctxt->URL, NULL);
	goto exit;
    }
    ret = xmlSchematronNewSchematron(ctxt);
    if (ret == NULL)
        goto exit;
    ctxt->schema = ret;

    /*
     * scan the schema elements
     */
    cur = root->children;
    NEXT_SCHEMATRON(cur);
    if (IS_SCHEMATRON(cur, "title")) {
        xmlChar *title = xmlNodeGetContent(cur);
	if (title != NULL) {
	    ret->title = xmlDictLookup(ret->dict, title, -1);
	    xmlFree(title);
	}
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    while (IS_SCHEMATRON(cur, "ns")) {
        xmlChar *prefix = xmlGetNoNsProp(cur, BAD_CAST "prefix");
        xmlChar *uri = xmlGetNoNsProp(cur, BAD_CAST "uri");
	if ((uri == NULL) || (uri[0] == 0)) {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"ns element has no uri", NULL, NULL);
	}
	if ((prefix == NULL) || (prefix[0] == 0)) {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"ns element has no prefix", NULL, NULL);
	}
	if ((prefix) && (uri)) {
	    xmlXPathRegisterNs(ctxt->xctxt, prefix, uri);
	    xmlSchematronAddNamespace(ctxt, prefix, uri);
	    ret->nbNs++;
	}
	if (uri)
	    xmlFree(uri);
	if (prefix)
	    xmlFree(prefix);
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    while (cur != NULL) {
	if (IS_SCHEMATRON(cur, "pattern")) {
	    xmlSchematronParsePattern(ctxt, cur);
	    ret->nbPattern++;
	} else {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"Expecting a pattern element instead of %s", cur->name, NULL);
	}
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    if (ret->nbPattern == 0) {
	xmlSchematronPErr(ctxt, root,
	    XML_SCHEMAP_NOROOT,
	    "The schematron document '%s' has no pattern",
	    ctxt->URL, NULL);
	goto exit;
    }
    /* the original document must be kept for reporting */
    ret->doc = doc;
    if (preserve) {
	    ret->preserve = 1;
    }
    preserve = 1;

exit:
    if (!preserve) {
	xmlFreeDoc(doc);
    }
    if (ret != NULL) {
	if (ctxt->nberrors != 0) {
	    xmlSchematronFree(ret);
	    ret = NULL;
	} else {
	    ret->namespaces = ctxt->namespaces;
	    ret->nbNamespaces = ctxt->nbNamespaces;
	    ctxt->namespaces = NULL;
	}
    }
    return (ret);
}